

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_ignoreOtherCallsExceptForTheExpectedOne_Test::testBody
          (TEST_MockCallTest_ignoreOtherCallsExceptForTheExpectedOne_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_MockCallTest_ignoreOtherCallsExceptForTheExpectedOne_Test *local_10;
  TEST_MockCallTest_ignoreOtherCallsExceptForTheExpectedOne_Test *this_local;
  
  local_10 = this;
  SimpleString::SimpleString(&local_20,"");
  pMVar2 = mock(&local_20,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_40,"foo");
  (*pMVar2->_vptr_MockSupport[3])(pMVar2,local_40);
  SimpleString::~SimpleString(local_40);
  SimpleString::~SimpleString(&local_20);
  SimpleString::SimpleString(&local_50,"");
  pMVar2 = mock(&local_50,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x24])();
  SimpleString::~SimpleString(&local_50);
  SimpleString::SimpleString(&local_60,"");
  pMVar2 = mock(&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_70,"bar");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_70);
  SimpleString::SimpleString(&local_80,"foo");
  MockActualCall::withParameter((MockActualCall *)CONCAT44(extraout_var,iVar1),&local_80,1);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_90,"");
  pMVar2 = mock(&local_90,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x27])();
  SimpleString::~SimpleString(&local_90);
  return;
}

Assistant:

TEST(MockCallTest, ignoreOtherCallsExceptForTheExpectedOne)
{
    mock().expectOneCall("foo");
    mock().ignoreOtherCalls();
    mock().actualCall("bar").withParameter("foo", 1);

    mock().clear();
}